

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stun_msg.c
# Opt level: O3

void stun_attr_msgint_init(stun_attr_msgint *attr,stun_msg_hdr *msg_hdr,void *key,size_t key_len)

{
  ushort uVar1;
  HMAC_SHA1_CTX ctx;
  HMAC_SHA1_CTX local_100;
  
  uVar1 = msg_hdr->length;
  HMAC_SHA1_Init(&local_100,(uint8_t *)key,key_len);
  HMAC_SHA1_Update(&local_100,(uint8_t *)msg_hdr,(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8) - 4);
  HMAC_SHA1_Final(attr->hmac,&local_100);
  return;
}

Assistant:

void stun_attr_msgint_init(stun_attr_msgint *attr,
                           const stun_msg_hdr *msg_hdr,
                           const void *key, size_t key_len) {
  uint8_t *p = (uint8_t *)msg_hdr;
  uint8_t *p_end = p + stun_msg_len(msg_hdr) - sizeof(*attr);
  HMAC_SHA1_CTX ctx;
  HMAC_SHA1_Init(&ctx, (const uint8_t*)key, key_len);
  HMAC_SHA1_Update(&ctx, p, p_end - p);
  HMAC_SHA1_Final(attr->hmac, &ctx);
}